

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O3

void __thiscall
dg::vr::VectorSet<llvm::Value_const*>::emplace<llvm::Value_const*&>
          (VectorSet<llvm::Value_const*> *this,Value **vals)

{
  iterator __position;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  _Var1;
  Value *val;
  Value *local_10;
  
  local_10 = *vals;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<llvm::Value_const*const*,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<llvm::Value_const*const>>
                    (*(undefined8 *)this,*(undefined8 *)(this + 8));
  __position._M_current = *(Value ***)(this + 8);
  if (_Var1._M_current == __position._M_current) {
    if (_Var1._M_current == *(Value ***)(this + 0x10)) {
      std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
      _M_realloc_insert<llvm::Value_const*>
                ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)this,__position,
                 &local_10);
    }
    else {
      *__position._M_current = local_10;
      *(long *)(this + 8) = *(long *)(this + 8) + 8;
    }
  }
  return;
}

Assistant:

void emplace(S &&...vals) {
        T val(std::forward<S>(vals)...);
        if (!contains(val))
            vec.emplace_back(std::move(val));
    }